

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

size_t __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_const_ref t,size_t index,
          size_t prevrank)

{
  size_t sVar1;
  _Elt_pointer pbVar2;
  subtree_const_ref t_00;
  word_type wVar3;
  size_t sVar4;
  long lVar5;
  bitview<bv::internal::bitarray_t<4096UL>::array> *this_00;
  pair<unsigned_long,_unsigned_long> pVar6;
  subtree_ref_base<true> local_58;
  
  if (t._size == index) {
    prevrank = prevrank + t._rank;
  }
  else if (index != 0) {
    if (t._height == 0) {
      pbVar2 = ((t._vector)->leaves).
               super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar5 = ((long)pbVar2 -
               (long)((t._vector)->leaves).
                     super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 9) + t._index;
      if (lVar5 == 0) {
        this_00 = pbVar2 + t._index;
      }
      else {
        this_00 = ((t._vector)->leaves).
                  super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[lVar5];
      }
      sVar4 = bitview<bv::internal::bitarray_t<4096UL>::array>::popcount(this_00,0,index);
      prevrank = prevrank + sVar4;
    }
    else {
      pVar6 = subtree_ref_base<true>::find_insert_point(&t,index);
      sVar4 = pVar6.first;
      if (sVar4 != 0) {
        sVar1 = ((t._vector)->ranks)._width;
        lVar5 = (t._vector)->degree * t._index;
        wVar3 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
                get(&((t._vector)->ranks)._bits,(lVar5 + -1 + sVar4) * sVar1,(lVar5 + sVar4) * sVar1
                   );
        prevrank = prevrank + wVar3;
      }
      subtree_ref_base<true>::child(&local_58,&t,sVar4);
      t_00._index = local_58._index;
      t_00._vector = local_58._vector;
      t_00._height = local_58._height;
      t_00._size = local_58._size;
      t_00._rank = local_58._rank;
      prevrank = getrank(this,t_00,pVar6.second,prevrank);
    }
  }
  return prevrank;
}

Assistant:

size_t bt_impl<W, AP>::getrank(subtree_const_ref t,
                                       size_t index, size_t prevrank) const
        {
            assert(index <= t.size() && "Index out of bounds");
            
            // Short circuit for special cases
            if(index == t.size())
                return t.rank() + prevrank;
            
            if(index == 0)
                return prevrank;
            
            if(t.is_leaf())
                return t.leaf().popcount(0, index) + prevrank;
            else {
                size_t child, new_index;
                tie(child, new_index) = t.find_insert_point(index);
                
                size_t pr = child == 0 ? prevrank
                                       : prevrank + t.ranks(child - 1);
                
                return getrank(t.child(child), new_index, pr);
            }
        }